

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makeduh.c
# Opt level: O0

int duh_add_signal(DUH *duh,DUH_SIGTYPE_DESC *desc,sigdata_t *sigdata)

{
  long *__src;
  DUH_SIGNAL *pDVar1;
  sigdata_t *in_RDX;
  DUH_SIGTYPE_DESC *in_RSI;
  long in_RDI;
  DUH_SIGNAL **signal;
  int local_4;
  
  if (((in_RDI == 0) || (in_RSI == (DUH_SIGTYPE_DESC *)0x0)) || (in_RDX == (sigdata_t *)0x0)) {
    local_4 = -1;
  }
  else {
    __src = (long *)realloc(*(void **)(in_RDI + 0x18),(long)(*(int *)(in_RDI + 0x10) + 1) << 3);
    if (__src == (long *)0x0) {
      local_4 = -1;
    }
    else {
      *(long **)(in_RDI + 0x18) = __src;
      memmove(__src + 1,__src,(long)*(int *)(in_RDI + 0x10) << 3);
      *(int *)(in_RDI + 0x10) = *(int *)(in_RDI + 0x10) + 1;
      pDVar1 = make_signal(in_RSI,in_RDX);
      *__src = (long)pDVar1;
      if (*__src == 0) {
        local_4 = -1;
      }
      else {
        local_4 = 0;
      }
    }
  }
  return local_4;
}

Assistant:

int DUMBEXPORT duh_add_signal(DUH *duh, DUH_SIGTYPE_DESC *desc, sigdata_t *sigdata)
{
	DUH_SIGNAL **signal;

	if ( !duh || !desc || !sigdata ) return -1;

	signal = ( DUH_SIGNAL ** ) realloc( duh->signal, ( duh->n_signals + 1 ) * sizeof( *duh->signal ) );
	if ( !signal ) return -1;
	duh->signal = signal;

	memmove( signal + 1, signal, duh->n_signals * sizeof( *signal ) );
	duh->n_signals++;

	signal[ 0 ] = make_signal( desc, sigdata );
	if ( !signal[ 0 ] ) return -1;

	return 0;
}